

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall nigel::Token::~Token(Token *this)

{
  Token *this_local;
  
  ~Token(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~Token() {}